

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

value * __thiscall
mjs::anon_unknown_35::unescape
          (value *__return_storage_ptr__,anon_unknown_35 *this,
          gc_heap_ptr<mjs::global_object> *global,wstring_view s)

{
  size_type sVar1;
  const_reference pvVar2;
  ulong uVar3;
  runtime_error *this_00;
  wchar_t *pwVar4;
  gc_heap *h;
  wstring_view local_80;
  string local_70 [2];
  ulong local_50;
  size_t i;
  wstring res;
  gc_heap_ptr<mjs::global_object> *global_local;
  wstring_view s_local;
  
  s_local._M_len = s._M_len;
  res.field_2._8_8_ = this;
  global_local = global;
  s_local._M_str = (wchar_t *)__return_storage_ptr__;
  std::__cxx11::wstring::wstring((wstring *)&i);
  local_50 = 0;
  do {
    uVar3 = local_50;
    sVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                      ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&global_local);
    if (sVar1 <= uVar3) {
      h = gc_heap_ptr_untyped::heap((gc_heap_ptr_untyped *)res.field_2._8_8_);
      local_80 = (wstring_view)
                 std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&i);
      string::string(local_70,h,&local_80);
      value::value(__return_storage_ptr__,local_70);
      string::~string(local_70);
      std::__cxx11::wstring::~wstring((wstring *)&i);
      return __return_storage_ptr__;
    }
    pvVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                       ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&global_local,
                        local_50);
    if (*pvVar2 == 0x25) {
      uVar3 = local_50 + 3;
      local_50 = local_50 + 1;
      sVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&global_local);
      if ((sVar1 < uVar3) ||
         ((pvVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                               &global_local,local_50), *pvVar2 == 0x75 &&
          (uVar3 = local_50 + 5,
          sVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&global_local
                            ), sVar1 < uVar3)))) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Invalid string in unescape");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&global_local,
                          local_50);
      if (*pvVar2 == 0x75) {
        pwVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                           ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&global_local,
                            local_50 + 1);
        get_hex_value4(pwVar4);
        std::__cxx11::wstring::push_back((wchar_t)&i);
        local_50 = local_50 + 4;
      }
      else {
        pwVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                           ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&global_local,
                            local_50);
        get_hex_value2(pwVar4);
        std::__cxx11::wstring::push_back((wchar_t)&i);
        local_50 = local_50 + 1;
      }
    }
    else {
      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&global_local,local_50);
      std::__cxx11::wstring::push_back((wchar_t)&i);
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

value unescape(const gc_heap_ptr<global_object>& global, const std::wstring_view s) {
    std::wstring res;
    for (size_t i = 0; i < s.length(); ++i) {
        if (s[i] != '%') {
            res.push_back(s[i]);
            continue;
        }
        ++i;
        if (i + 2 > s.length() || (s[i] == 'u' && i + 5 > s.length())) {
            throw std::runtime_error("Invalid string in unescape");
        }
        if (s[i] == 'u') {
            res.push_back(static_cast<wchar_t>(get_hex_value4(&s[i+1])));
            i += 4;
        } else {
            res.push_back(static_cast<wchar_t>(get_hex_value2(&s[i])));
            i += 1;
        }
    }
    return value{string{global.heap(), res}};
}